

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alex.h
# Opt level: O3

void __thiscall
alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>::expand_root
          (Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false> *this,
          int key,bool expand_left)

{
  int *piVar1;
  longlong *plVar2;
  short sVar3;
  long lVar4;
  Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false> *pAVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  AlexNode<int,_int> *pAVar9;
  AlexNode<int,_int> **ppAVar10;
  AlexNode<int,_int> **ppAVar11;
  data_node_type *pdVar12;
  data_node_type *pdVar13;
  long *plVar14;
  int iVar15;
  model_node_type *node;
  AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false> *this_00;
  ulong uVar16;
  long lVar17;
  undefined7 in_register_00000011;
  ulong uVar18;
  long lVar19;
  uint8_t uVar20;
  int iVar21;
  int right_boundary;
  uint uVar22;
  int j;
  AlexNode<int,_int> *pAVar23;
  double dVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined8 in_XMM3_Qb;
  int local_90;
  int local_7c;
  new_allocator<alex::AlexNode<int,_int>_*> local_72;
  new_allocator<alex::AlexNode<int,_int>_*> local_71;
  int local_70;
  int local_6c;
  int right_boundary_value;
  int left_boundary_value;
  long local_60;
  ulong local_58;
  long local_50;
  Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false> *local_48;
  int local_3c;
  long local_38;
  size_type __n;
  
  local_7c = (this->istats_).key_domain_max_;
  iVar8 = (this->istats_).key_domain_min_;
  pAVar23 = this->root_node_;
  iVar21 = local_7c - iVar8;
  if ((int)CONCAT71(in_register_00000011,expand_left) == 0) {
    iVar7 = get_max_key(this);
    if (iVar7 <= key) {
      iVar7 = key;
    }
    uVar6 = (iVar7 + ~(this->istats_).key_domain_max_ + iVar21) / iVar21;
    uVar6 = (int)uVar6 >> 1 | uVar6;
    uVar6 = (int)uVar6 >> 2 | uVar6;
    uVar6 = (int)uVar6 >> 4 | uVar6;
    uVar6 = (int)uVar6 >> 8 | uVar6;
    uVar6 = (int)uVar6 >> 0x10 | uVar6;
    iVar7 = (this->istats_).key_domain_min_;
    uVar22 = uVar6 + 1;
    __n = (size_type)uVar22;
    iVar15 = ((int)((uVar6 + 1) - ((int)uVar22 >> 0x1f)) >> 1) * iVar21;
    local_7c = 0x7fffffff;
    if (iVar15 <= 0x3fffffff - iVar7 / 2) {
      local_7c = iVar7 + iVar15 * 2;
    }
    (this->istats_).num_keys_at_last_right_domain_resize = (this->stats_).num_keys;
    (this->istats_).num_keys_above_key_domain = 0;
    this_00 = (AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>
               *)this->root_node_;
    if ((this_00->super_AlexNode<int,_int>).is_leaf_ == false) {
      do {
        this_00 = *(AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>
                    **)((long)this_00->next_leaf_ + (long)*(int *)&this_00->allocator_ * 8 + -8);
      } while ((this_00->super_AlexNode<int,_int>).is_leaf_ != true);
    }
  }
  else {
    uVar6 = get_min_key(this);
    if (key <= (int)uVar6) {
      uVar6 = key;
    }
    uVar6 = (int)(~uVar6 + local_7c) / iVar21;
    uVar6 = (int)uVar6 >> 1 | uVar6;
    uVar6 = (int)uVar6 >> 2 | uVar6;
    uVar6 = (int)uVar6 >> 4 | uVar6;
    uVar6 = (int)uVar6 >> 8 | uVar6;
    uVar6 = (int)uVar6 >> 0x10 | uVar6;
    iVar7 = (this->istats_).key_domain_max_;
    uVar22 = uVar6 + 1;
    __n = (size_type)uVar22;
    iVar15 = ((int)((uVar6 + 1) - ((int)uVar22 >> 0x1f)) >> 1) * iVar21;
    iVar8 = -0x80000000;
    if (iVar15 <= iVar7 / 2 + 0x40000000) {
      iVar8 = iVar7 + iVar15 * -2;
    }
    (this->istats_).num_keys_at_last_left_domain_resize = (this->stats_).num_keys;
    (this->istats_).num_keys_below_key_domain = 0;
    for (this_00 = (AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>
                    *)this->root_node_; (this_00->super_AlexNode<int,_int>).is_leaf_ == false;
        this_00 = (AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>
                   *)(this_00->next_leaf_->super_AlexNode<int,_int>)._vptr_AlexNode) {
    }
  }
  iVar7 = (int)__n;
  local_70 = iVar8;
  if (iVar7 < 2) {
    __assert_fail("expansion_factor > 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]ALEX/src/core/alex.h"
                  ,0x589,
                  "void alex::Alex<int, int, alex::AlexCompare, std::allocator<std::pair<int, int>>, false>::expand_root(T, bool) [T = int, P = int, Compare = alex::AlexCompare, Alloc = std::allocator<std::pair<int, int>>, allow_duplicates = false]"
                 );
  }
  iVar8 = *(int *)&pAVar23[1].is_leaf_;
  uVar18 = (ulong)(this->derived_params_).max_fanout;
  uVar16 = (long)iVar8 * __n;
  local_6c = iVar21;
  if (uVar16 < uVar18 || uVar16 - uVar18 == 0) {
    piVar1 = &(this->stats_).num_model_node_expansions;
    *piVar1 = *piVar1 + 1;
    plVar2 = &(this->stats_).num_model_node_expansion_pointers;
    *plVar2 = *plVar2 + (long)iVar8;
    iVar7 = iVar7 * iVar8;
    lVar17 = 0;
    ppAVar11 = __gnu_cxx::new_allocator<alex::AlexNode<int,_int>_*>::allocate
                         (&local_71,(long)iVar7,(void *)0x0);
    uVar6 = *(uint *)&pAVar23[1].is_leaf_;
    local_58 = (ulong)uVar6;
    local_90 = iVar7;
    if (expand_left) {
      local_90 = iVar7 - uVar6;
      local_58 = 0;
      lVar17 = (long)local_90;
      (pAVar23->model_).b_ = (double)local_90 + (pAVar23->model_).b_;
    }
    if (0 < (int)uVar6) {
      uVar16 = 0;
      do {
        ppAVar11[lVar17 + uVar16] =
             *(AlexNode<int,_int> **)((long)pAVar23[1].model_.a_ + uVar16 * 8);
        uVar16 = uVar16 + 1;
      } while (uVar6 != uVar16);
    }
    operator_delete((void *)pAVar23[1].model_.a_,(long)(int)uVar6 << 3);
    pAVar23[1].model_.a_ = (double)ppAVar11;
    *(int *)&pAVar23[1].is_leaf_ = iVar7;
  }
  else {
    pAVar9 = (AlexNode<int,_int> *)operator_new(0x40);
    sVar3 = pAVar23->level_;
    pAVar9->is_leaf_ = false;
    pAVar9->duplication_factor_ = '\0';
    pAVar9->level_ = sVar3 + -1;
    pAVar9->cost_ = 0.0;
    pAVar9->_vptr_AlexNode = (_func_int **)&PTR__AlexModelNode_00164bd8;
    pAVar9[1]._vptr_AlexNode = (_func_int **)&this->field_0xbd;
    pAVar9[1].model_.a_ = 0.0;
    iVar8._0_1_ = pAVar23[1].is_leaf_;
    iVar8._1_1_ = pAVar23[1].duplication_factor_;
    iVar8._2_2_ = pAVar23[1].level_;
    (pAVar9->model_).a_ = (pAVar23->model_).a_ / (double)iVar8;
    dVar24 = (pAVar23->model_).b_ / (double)iVar8;
    (pAVar9->model_).b_ =
         (double)((ulong)expand_left * (long)(dVar24 + (double)(iVar7 + -1)) +
                 (ulong)!expand_left * (long)dVar24);
    pAVar9[1].is_leaf_ = (bool)(char)iVar7;
    pAVar9[1].duplication_factor_ = (char)((uint)iVar7 >> 8);
    pAVar9[1].level_ = (short)((uint)iVar7 >> 0x10);
    ppAVar10 = __gnu_cxx::new_allocator<alex::AlexNode<int,_int>_*>::allocate
                         (&local_72,__n,(void *)0x0);
    pAVar9[1].model_.a_ = (double)ppAVar10;
    ppAVar11 = ppAVar10 + (__n - 1);
    if (!expand_left) {
      ppAVar11 = ppAVar10;
    }
    *ppAVar11 = pAVar23;
    this->root_node_ = pAVar9;
    local_58 = (ulong)!expand_left;
    local_90 = iVar7 + -1 + (uint)!expand_left;
    *this->superroot_->children_ = pAVar9;
    (this->superroot_->super_AlexNode<int,_int>).level_ = pAVar9->level_ + -1;
    pAVar23 = pAVar9;
  }
  auVar25._8_8_ = 0;
  auVar25._0_8_ = (pAVar23->model_).a_;
  auVar26._8_8_ = 0;
  auVar26._0_8_ = (pAVar23->model_).b_;
  iVar8 = (int)local_58;
  if (expand_left) {
    auVar27._0_8_ = (double)local_70;
    auVar27._8_8_ = in_XMM3_Qb;
    auVar25 = vfmadd213sd_fma(auVar27,auVar25,auVar26);
    iVar21 = (int)auVar25._0_8_;
    if ((int)auVar25._0_8_ < iVar8) {
      iVar21 = iVar8;
    }
    local_60 = CONCAT44(local_60._4_4_,iVar21);
    iVar21 = local_90;
  }
  else {
    auVar28._0_8_ = (double)local_7c;
    auVar28._8_8_ = in_XMM3_Qb;
    local_60 = CONCAT44(local_60._4_4_,iVar8);
    auVar25 = vfmadd213sd_fma(auVar28,auVar25,auVar26);
    iVar21 = (int)auVar25._0_8_ + 1;
    if (local_90 <= iVar21) {
      iVar21 = local_90;
    }
  }
  uVar6 = (iVar8 - local_90) + *(int *)&pAVar23[1].is_leaf_;
  if (*(int *)&pAVar23[1].is_leaf_ % (int)uVar6 == 0) {
    uVar20 = '\0';
    for (uVar22 = uVar6; 1 < uVar22; uVar22 = (int)uVar22 >> 1) {
      uVar20 = uVar20 + '\x01';
    }
    local_48 = this;
    if (expand_left) {
      left_boundary_value = (this->istats_).key_domain_min_;
      iVar7 = AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>
              ::lower_bound<int>(this_00,&left_boundary_value);
      pdVar13 = this_00;
      iVar21 = local_90;
      if (iVar8 < local_90) {
        do {
          local_50 = CONCAT44(local_50._4_4_,iVar21);
          iVar21 = iVar21 - uVar6;
          iVar8 = 0;
          if ((int)local_60 < iVar21) {
            left_boundary_value = left_boundary_value - local_6c;
            iVar8 = AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>
                    ::lower_bound<int>(this_00,&left_boundary_value);
          }
          pdVar12 = bulk_load_leaf_node_from_existing
                              (local_48,this_00,iVar8,iVar7,true,(FTNode *)0x0,false,false,false);
          (pdVar12->super_AlexNode<int,_int>).level_ = pAVar23->level_ + 1;
          (pdVar12->super_AlexNode<int,_int>).duplication_factor_ = uVar20;
          if (pdVar13 != (data_node_type *)0x0) {
            pdVar13->prev_leaf_ = pdVar12;
          }
          pdVar12->next_leaf_ = pdVar13;
          if (0 < (int)uVar6) {
            lVar17 = (long)(int)local_50;
            do {
              *(data_node_type **)((long)pAVar23[1].model_.a_ + -8 + lVar17 * 8) = pdVar12;
              lVar17 = lVar17 + -1;
            } while (iVar21 < lVar17);
          }
          pdVar13 = pdVar12;
          iVar7 = iVar8;
        } while ((int)local_58 < iVar21);
      }
    }
    else {
      right_boundary_value = (this->istats_).key_domain_max_;
      iVar7 = AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>
              ::lower_bound<int>(this_00,&right_boundary_value);
      if (iVar8 < local_90) {
        local_50 = (long)(int)uVar6;
        local_60 = (long)iVar21;
        local_38 = (long)local_90;
        pdVar13 = (data_node_type *)0x0;
        lVar17 = (long)(int)local_58;
        do {
          lVar19 = lVar17 + local_50;
          if (lVar19 < local_60) {
            right_boundary_value = right_boundary_value + local_6c;
            local_3c = iVar7;
            iVar8 = AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>
                    ::lower_bound<int>(this_00,&right_boundary_value);
            iVar7 = local_3c;
          }
          else {
            iVar8 = this_00->data_capacity_;
          }
          pdVar12 = bulk_load_leaf_node_from_existing
                              (local_48,this_00,iVar7,iVar8,true,(FTNode *)0x0,false,false,false);
          (pdVar12->super_AlexNode<int,_int>).level_ = pAVar23->level_ + 1;
          (pdVar12->super_AlexNode<int,_int>).duplication_factor_ = uVar20;
          if (pdVar13 != (data_node_type *)0x0) {
            pdVar13->next_leaf_ = pdVar12;
          }
          pdVar12->prev_leaf_ = pdVar13;
          if (0 < (int)uVar6) {
            do {
              *(data_node_type **)((long)pAVar23[1].model_.a_ + lVar17 * 8) = pdVar12;
              lVar17 = lVar17 + 1;
            } while (lVar17 < lVar19);
          }
          pdVar13 = pdVar12;
          lVar17 = lVar19;
          iVar7 = iVar8;
        } while (lVar19 < local_38);
      }
    }
    pAVar5 = local_48;
    iVar8 = local_70;
    if (expand_left) {
      AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>::
      erase_range(this_00,local_70,(local_48->istats_).key_domain_min_,false);
      lVar19 = 0x40;
      plVar14 = (long *)((long)pAVar23[1].model_.a_ + -8 + (long)local_90 * 8);
      lVar17 = 0x38;
    }
    else {
      AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>::
      erase_range(this_00,(local_48->istats_).key_domain_max_,local_7c,true);
      lVar17 = 0x40;
      lVar19 = 0x38;
      plVar14 = (long *)((long)(int)local_58 * 8 + (long)pAVar23[1].model_.a_);
    }
    lVar4 = *plVar14;
    *(long *)((long)&(this_00->super_AlexNode<int,_int>)._vptr_AlexNode + lVar19) = lVar4;
    *(AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false> **)
     (lVar4 + lVar17) = this_00;
    (pAVar5->istats_).key_domain_min_ = iVar8;
    (pAVar5->istats_).key_domain_max_ = local_7c;
    return;
  }
  __assert_fail("root->num_children_ % n == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]ALEX/src/core/alex.h"
                ,0x5d2,
                "void alex::Alex<int, int, alex::AlexCompare, std::allocator<std::pair<int, int>>, false>::expand_root(T, bool) [T = int, P = int, Compare = alex::AlexCompare, Alloc = std::allocator<std::pair<int, int>>, allow_duplicates = false]"
               );
}

Assistant:

void expand_root(T key, bool expand_left) {
    auto root = static_cast<model_node_type*>(root_node_);

    // Find the new bounds of the key domain.
    // Need to be careful to avoid overflows in the key type.
    T domain_size = istats_.key_domain_max_ - istats_.key_domain_min_;
    int expansion_factor;
    T new_domain_min = istats_.key_domain_min_;
    T new_domain_max = istats_.key_domain_max_;
    data_node_type* outermost_node;
    if (expand_left) {
      if constexpr (std::is_integral<T>::value){
        T key_difference = istats_.key_domain_min_ - std::min(key, get_min_key());
        expansion_factor = pow_2_round_up((key_difference + domain_size - 1) / domain_size + 1);
      }
      else{
        auto key_difference = static_cast<double>(istats_.key_domain_min_ -
                                                std::min(key, get_min_key()));
        expansion_factor = pow_2_round_up(static_cast<int>(
            std::ceil((key_difference + domain_size) / domain_size)));
      }
      // Check for overflow. To avoid overflow on signed types while doing
      // this check, we do comparisons using half of the relevant quantities.
      T half_expandable_domain =
          istats_.key_domain_max_ / 2 - std::numeric_limits<T>::lowest() / 2;
      T half_expanded_domain_size = expansion_factor / 2 * domain_size;
      if (half_expandable_domain < half_expanded_domain_size) {
        new_domain_min = std::numeric_limits<T>::lowest();
      } else {
        new_domain_min = istats_.key_domain_max_;
        new_domain_min -= half_expanded_domain_size;
        new_domain_min -= half_expanded_domain_size;
      }
      istats_.num_keys_at_last_left_domain_resize = stats_.num_keys;
      istats_.num_keys_below_key_domain = 0;
      outermost_node = first_data_node();
    } else {
      if constexpr (std::is_integral<T>::value){
        T key_difference = std::max(key, get_max_key()) - istats_.key_domain_max_;
        expansion_factor = pow_2_round_up((key_difference + domain_size - 1) / domain_size + 1);
      }
      else{
        auto key_difference = static_cast<double>(std::max(key, get_max_key()) -
                                                istats_.key_domain_max_);
        expansion_factor = pow_2_round_up(static_cast<int>(
            std::ceil((key_difference + domain_size) / domain_size)));
      }
      // Check for overflow. To avoid overflow on signed types while doing
      // this check, we do comparisons using half of the relevant quantities.
      T half_expandable_domain =
          std::numeric_limits<T>::max() / 2 - istats_.key_domain_min_ / 2;
      T half_expanded_domain_size = expansion_factor / 2 * domain_size;
      if (half_expandable_domain < half_expanded_domain_size) {
        new_domain_max = std::numeric_limits<T>::max();
      } else {
        new_domain_max = istats_.key_domain_min_;
        new_domain_max += half_expanded_domain_size;
        new_domain_max += half_expanded_domain_size;
      }
      istats_.num_keys_at_last_right_domain_resize = stats_.num_keys;
      istats_.num_keys_above_key_domain = 0;
      outermost_node = last_data_node();
    }
    assert(expansion_factor > 1);

    // Modify the root node appropriately
    int new_nodes_start;  // index of first pointer to a new node
    int new_nodes_end;    // exclusive
    if (static_cast<size_t>(root->num_children_) * expansion_factor <=
        static_cast<size_t>(derived_params_.max_fanout)) {
      // Expand root node
      stats_.num_model_node_expansions++;
      stats_.num_model_node_expansion_pointers += root->num_children_;

      int new_num_children = root->num_children_ * expansion_factor;
      auto new_children = new (pointer_allocator().allocate(new_num_children))
          AlexNode<T, P>*[new_num_children];
      int copy_start;
      if (expand_left) {
        copy_start = new_num_children - root->num_children_;
        new_nodes_start = 0;
        new_nodes_end = copy_start;
        root->model_.b_ += new_num_children - root->num_children_;
      } else {
        copy_start = 0;
        new_nodes_start = root->num_children_;
        new_nodes_end = new_num_children;
      }
      for (int i = 0; i < root->num_children_; i++) {
        new_children[copy_start + i] = root->children_[i];
      }
      pointer_allocator().deallocate(root->children_, root->num_children_);
      root->children_ = new_children;
      root->num_children_ = new_num_children;
    } else {
      // Create new root node
      auto new_root = new (model_node_allocator().allocate(1))
          model_node_type(static_cast<short>(root->level_ - 1), allocator_);
      new_root->model_.a_ = root->model_.a_ / root->num_children_;
      new_root->model_.b_ = root->model_.b_ / root->num_children_;
      if (expand_left) {
        new_root->model_.b_ += expansion_factor - 1;
      }
      new_root->num_children_ = expansion_factor;
      new_root->children_ = new (pointer_allocator().allocate(expansion_factor))
          AlexNode<T, P>*[expansion_factor];
      if (expand_left) {
        new_root->children_[expansion_factor - 1] = root;
        new_nodes_start = 0;
      } else {
        new_root->children_[0] = root;
        new_nodes_start = 1;
      }
      new_nodes_end = new_nodes_start + expansion_factor - 1;
      root_node_ = new_root;
      update_superroot_pointer();
      root = new_root;
    }
    // Determine if new nodes represent a range outside the key type's domain.
    // This happens when we're preventing overflows.
    int in_bounds_new_nodes_start = new_nodes_start;
    int in_bounds_new_nodes_end = new_nodes_end;
    if (expand_left) {
      in_bounds_new_nodes_start =
          std::max(new_nodes_start, root->model_.predict(new_domain_min));
    } else {
      in_bounds_new_nodes_end =
          std::min(new_nodes_end, root->model_.predict(new_domain_max) + 1);
    }

    // Fill newly created child pointers of the root node with new data nodes.
    // To minimize empty new data nodes, we create a new data node per n child
    // pointers, where n is the number of pointers to existing nodes.
    // Requires reassigning some keys from the outermost pre-existing data node
    // to the new data nodes.
    int n = root->num_children_ - (new_nodes_end - new_nodes_start);
    assert(root->num_children_ % n == 0);
    auto new_node_duplication_factor =
        static_cast<uint8_t>(log_2_round_down(n));
    if (expand_left) {
      T left_boundary_value = istats_.key_domain_min_;
      int left_boundary = outermost_node->lower_bound(left_boundary_value);
      data_node_type* next = outermost_node;
      for (int i = new_nodes_end; i > new_nodes_start; i -= n) {
        // if (i <= in_bounds_new_nodes_start) {
        //   // Do not initialize nodes that fall outside the key type's domain
        //   break;
        // }
        int right_boundary = left_boundary;
        if (i - n <= in_bounds_new_nodes_start) {
          left_boundary = 0;
        } else {
          left_boundary_value -= domain_size;
          left_boundary = outermost_node->lower_bound(left_boundary_value);
        }
        data_node_type* new_node = bulk_load_leaf_node_from_existing(
            outermost_node, left_boundary, right_boundary, true);
        new_node->level_ = static_cast<short>(root->level_ + 1);
        new_node->duplication_factor_ = new_node_duplication_factor;
        if (next) {
          next->prev_leaf_ = new_node;
        }
        new_node->next_leaf_ = next;
        next = new_node;
        for (int j = i - 1; j >= i - n; j--) {
          root->children_[j] = new_node;
        }
      }
    } else {
      T right_boundary_value = istats_.key_domain_max_;
      int right_boundary = outermost_node->lower_bound(right_boundary_value);
      data_node_type* prev = nullptr;
      for (int i = new_nodes_start; i < new_nodes_end; i += n) {
        // if (i >= in_bounds_new_nodes_end) {
        //   // Do not initialize nodes that fall outside the key type's domain
        //   break;
        // }
        int left_boundary = right_boundary;
        if (i + n >= in_bounds_new_nodes_end) {
          right_boundary = outermost_node->data_capacity_;
        } else {
          right_boundary_value += domain_size;
          right_boundary = outermost_node->lower_bound(right_boundary_value);
        }
        data_node_type* new_node = bulk_load_leaf_node_from_existing(
            outermost_node, left_boundary, right_boundary, true);
        new_node->level_ = static_cast<short>(root->level_ + 1);
        new_node->duplication_factor_ = new_node_duplication_factor;
        if (prev) {
          prev->next_leaf_ = new_node;
        }
        new_node->prev_leaf_ = prev;
        prev = new_node;
        for (int j = i; j < i + n; j++) {
          root->children_[j] = new_node;
        }
      }
    }

    // Connect leaf nodes and remove reassigned keys from outermost pre-existing
    // node.
    if (expand_left) {
      outermost_node->erase_range(new_domain_min, istats_.key_domain_min_);
      auto last_new_leaf =
          static_cast<data_node_type*>(root->children_[new_nodes_end - 1]);
      outermost_node->prev_leaf_ = last_new_leaf;
      last_new_leaf->next_leaf_ = outermost_node;
    } else {
      outermost_node->erase_range(istats_.key_domain_max_, new_domain_max,
                                  true);
      auto first_new_leaf =
          static_cast<data_node_type*>(root->children_[new_nodes_start]);
      outermost_node->next_leaf_ = first_new_leaf;
      first_new_leaf->prev_leaf_ = outermost_node;
    }

    istats_.key_domain_min_ = new_domain_min;
    istats_.key_domain_max_ = new_domain_max;
  }